

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd64.cpp
# Opt level: O0

void stackjit::Amd64Backend::andIntToReg(CodeGen *codeGen,Registers dest,int value,bool is32bits)

{
  ulong local_30;
  size_t i;
  byte local_1d;
  IntToBytes converter;
  int local_18;
  bool is32bits_local;
  int value_local;
  Registers dest_local;
  CodeGen *codeGen_local;
  
  converter.byteValues[3] = is32bits;
  local_18 = value;
  is32bits_local = (bool)dest;
  _value_local = codeGen;
  if (!is32bits) {
    converter.byteValues[2] = 'H';
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (codeGen,converter.byteValues + 2);
  }
  if (is32bits_local == false) {
    converter.byteValues[1] = '%';
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (_value_local,converter.byteValues + 1);
  }
  else {
    converter.byteValues[0] = 0x81;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (_value_local,converter.byteValues);
    local_1d = is32bits_local | 0xe0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(_value_local,&local_1d);
  }
  i._4_4_ = local_18;
  for (local_30 = 0; local_30 < 4; local_30 = local_30 + 1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (_value_local,(value_type_conflict1 *)((long)&i + local_30 + 4));
  }
  return;
}

Assistant:

void Amd64Backend::andIntToReg(CodeGen& codeGen, Registers dest, int value, bool is32bits) {
		if (!is32bits) {
			codeGen.push_back(0x48);
		}

		if (dest == Registers::AX) {
			codeGen.push_back(0x25);
		} else {
			codeGen.push_back(0x81);
			codeGen.push_back(0xe0 | (Byte)dest);
		}

		IntToBytes converter;
		converter.intValue = value;

		for (std::size_t i = 0; i < sizeof(int); i++) {
			codeGen.push_back(converter.byteValues[i]);
		}
	}